

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polling_util.hpp
# Opt level: O0

void __thiscall
zmq::fast_vector_t<pollfd,_16UL>::fast_vector_t(fast_vector_t<pollfd,_16UL> *this,size_t nitems_)

{
  void *pvVar1;
  ulong in_RSI;
  long in_RDI;
  
  if (in_RSI < 0x11) {
    *(long *)(in_RDI + 0x80) = in_RDI;
  }
  else {
    pvVar1 = malloc(in_RSI << 3);
    *(void **)(in_RDI + 0x80) = pvVar1;
    if (*(long *)(in_RDI + 0x80) == 0) {
      fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/polling_util.hpp"
              ,0x33);
      fflush(_stderr);
      zmq_abort((char *)0x1ce191);
    }
  }
  return;
}

Assistant:

explicit fast_vector_t (const size_t nitems_)
    {
        if (nitems_ > S) {
            _buf = static_cast<T *> (malloc (nitems_ * sizeof (T)));
            //  TODO since this function is called by a client, we could return errno == ENOMEM here
            alloc_assert (_buf);
        } else {
            _buf = _static_buf;
        }
    }